

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::base::debug::CrashHandler::setHandler(CrashHandler *this,Handler *cHandler)

{
  __sighandler_t p_Var1;
  long lVar2;
  
  this->m_handler = *cHandler;
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
    p_Var1 = signal(*(int *)((long)&DAT_00132870 + lVar2),(__sighandler_t)*cHandler);
    this->m_handler = (Handler)p_Var1;
  }
  return;
}

Assistant:

void setHandler(const Handler& cHandler) {
        m_handler = cHandler;
#if defined(ELPP_HANDLE_SIGABRT)
            int i = 0;  // SIGABRT is at base::consts::kCrashSignals[0]
#else
            int i = 1;
#endif  // defined(ELPP_HANDLE_SIGABRT)
        for (; i < base::consts::kCrashSignalsCount; ++i) {
            m_handler = signal(base::consts::kCrashSignals[i].numb, cHandler);
        }
    }